

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O2

void __thiscall bf_crc::print_settings(bf_crc *this)

{
  uint32_t uVar1;
  ostream *poVar2;
  bool v;
  bool v_00;
  char *this_00;
  string local_40;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Brute Force CRC Settings");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"CRC Width\t\t: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->crc_width_);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"Truncated Polynomial\t");
  if (this->polynomial_ == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,": 0x0 to 0x");
    *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,~(-1 << ((byte)this->crc_width_ & 0x1f)));
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,": 0x");
    *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"Truncated Polynomial\t");
  uVar1 = this->polynomial_;
  poVar2 = std::operator<<((ostream *)&std::cout,": 0x");
  *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  if (uVar1 == 0) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," to 0x");
    *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  }
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar2);
  if (this->probe_initial_ == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Initial value\t\t: 0x0 to 0x");
    *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Initial value\t\t: 0x");
    *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  }
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar2);
  if (this->probe_final_xor_ == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Final xor\t\t: 0x0 to 0x");
    *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"final xor\t\t: 0x");
    *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  }
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Probe reflect in\t: ");
  bool_to_str_abi_cxx11_(&local_40,(bf_crc *)(ulong)this->probe_reflected_input_,v);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_40);
  poVar2 = std::operator<<((ostream *)&std::cout,"Probe reflect out\t: ");
  bool_to_str_abi_cxx11_(&local_40,(bf_crc *)(ulong)this->probe_reflected_output_,v_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_40);
  this_00 = "Feed type               : ";
  poVar2 = std::operator<<((ostream *)&std::cout,"Feed type               : ");
  feed_type_to_str_abi_cxx11_(&local_40,(bf_crc *)this_00,this->feed_type_);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_40);
  poVar2 = std::operator<<((ostream *)&std::cout,"Permutation count\t: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::ostream::flush();
  return;
}

Assistant:

void bf_crc::print_settings(void)
{

  // Output Brute Force Settings
  std::cout << "Brute Force CRC Settings" << std::endl;
  std::cout << "------------------------" << std::endl;

  std::cout << "CRC Width		: " << crc_width_ << std::endl;

  std::cout << "Truncated Polynomial	";
  if (polynomial_ > 0)
    std::cout << ": 0x" << std::hex << polynomial_ << std::endl;
  else
    std::cout << ": 0x0 to 0x" << std::hex << MAX_VALUE(crc_width_) << std::endl;


  std::cout << "Truncated Polynomial	";
	if (polynomial_ > 0)
		std::cout << ": 0x" << std::hex << polynomial_ << std::dec << std::endl;
	else
		std::cout << ": 0x" << std::hex << polynomial_start_ << " to 0x" << std::hex << polynomial_end_ << std::dec << std::endl;

	if (probe_initial_)
		std::cout << "Initial value		: 0x0 to 0x" << std::hex << max_value(crc_width_) << std::dec << std::endl;
	else
		std::cout << "Initial value		: 0x" << std::hex << initial_ << std::dec << std::endl;

	if (probe_final_xor_)
		std::cout << "Final xor		: 0x0 to 0x" << std::hex << max_value(crc_width_) << std::dec << std::endl;
	else
		std::cout << "final xor		: 0x" <<std::hex << final_xor_ << std::dec << std::endl;

	std::cout << "Probe reflect in	: " << bool_to_str(probe_reflected_input_) << std::endl;
	std::cout << "Probe reflect out	: " << bool_to_str(probe_reflected_output_) << std::endl;
	std::cout << "Feed type               : " << feed_type_to_str(feed_type_) << std::endl;

	std::cout << "Permutation count	: " << test_vector_count_ << std::endl;
	std::cout << std::endl << std::flush;	
}